

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

bool __thiscall chrono::ChOptimizerGradient::DoOptimize(ChOptimizerGradient *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double *pdVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  Index IVar8;
  double *pdVar9;
  Index IVar10;
  int iVar11;
  Index index;
  Index size_8;
  long lVar12;
  ulong uVar13;
  Index index_1;
  int iVar14;
  SrcEvaluatorType srcEvaluator;
  ActualDstType actualDst;
  ulong size_00;
  Index index_8;
  ulong uVar15;
  char *pcVar16;
  Index size;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_ZMM2 [64];
  ChVectorDynamic<> mX;
  ChVectorDynamic<> mXmid;
  ChVectorDynamic<> mG;
  ChVectorDynamic<> mXguess;
  ChVectorDynamic<> mX2;
  ChVectorDynamic<> mX1;
  ChVectorDynamic<> mGcnold;
  ChVectorDynamic<> mGcn;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_178;
  double local_168;
  undefined8 uStack_160;
  double local_150;
  double local_148;
  double local_140;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_138;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_128;
  double local_118;
  undefined8 uStack_110;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_108;
  scalar_sum_op<double,_double> local_e9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_d8;
  int local_bc;
  double local_b8;
  undefined8 uStack_b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  double local_80;
  char *local_78;
  int local_6c;
  double local_68;
  undefined8 uStack_60;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_50;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_40;
  
  local_bc = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  local_b8 = this->initial_step;
  uStack_b0 = 0;
  local_178.m_storage.m_data = (double *)0x0;
  local_178.m_storage.m_rows = 0;
  size_00 = (ulong)local_bc;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_178,size_00);
  local_108.m_storage.m_data = (double *)0x0;
  local_108.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_108,size_00);
  local_128.m_storage.m_data = (double *)0x0;
  local_128.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_128,size_00);
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,size_00);
  local_a8.m_storage.m_data = (double *)0x0;
  local_a8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a8,size_00);
  local_138.m_storage.m_data = (double *)0x0;
  local_138.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_138,size_00);
  local_d8.m_storage.m_data = (double *)0x0;
  local_d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_d8,size_00);
  local_e8.m_storage.m_data = (double *)0x0;
  local_e8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_e8,size_00);
  if (0 < local_bc) {
    pdVar5 = (this->super_ChOptimizer).xv;
    uVar15 = 0;
    do {
      if ((~(local_178.m_storage.m_rows >> 0x3f) & local_178.m_storage.m_rows) == uVar15)
      goto LAB_007ebc6b;
      local_178.m_storage.m_data[uVar15] = pdVar5[uVar15];
      uVar15 = uVar15 + 1;
    } while (size_00 != uVar15);
  }
  local_140 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_178);
  local_78 = (this->super_ChOptimizer).err_message;
  local_148 = 0.0;
  local_150 = 0.0;
  local_118 = 0.0;
  local_80 = 0.0;
  do {
    auVar19 = ZEXT1664(in_ZMM2._0_16_);
    ChOptimizer::Eval_grad
              (&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_178,
               (ChVectorDynamic<> *)&local_128);
    if (this->do_conjugate == true) {
      local_50.m_xpr = (XprTypeNested)&local_128;
      if (local_128.m_storage.m_rows == 0) {
        local_168 = 0.0;
      }
      else {
        if (local_128.m_storage.m_rows < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        local_40.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
        .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_128.m_storage.m_data;
        local_168 = Eigen::internal::
                    redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                    ::
                    run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                              (&local_40,&local_e9,&local_50);
      }
      IVar8 = local_128.m_storage.m_rows;
      pdVar5 = local_128.m_storage.m_data;
      if (local_98.m_storage.m_rows != local_128.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_98,local_128.m_storage.m_rows,1);
      }
      IVar10 = local_98.m_storage.m_rows;
      pdVar9 = local_98.m_storage.m_data;
      if (local_98.m_storage.m_rows == IVar8) {
        uVar15 = local_98.m_storage.m_rows + 7;
        if (-1 < local_98.m_storage.m_rows) {
          uVar15 = local_98.m_storage.m_rows;
        }
        uVar15 = uVar15 & 0xfffffffffffffff8;
        if (7 < local_98.m_storage.m_rows) {
          lVar12 = 0;
          do {
            *(undefined1 (*) [64])(local_98.m_storage.m_data + lVar12) =
                 *(undefined1 (*) [64])(pdVar5 + lVar12);
            lVar12 = lVar12 + 8;
          } while (lVar12 < (long)uVar15);
        }
        uVar13 = uVar15;
        if ((long)uVar15 < local_98.m_storage.m_rows) {
          do {
            local_98.m_storage.m_data[uVar13] = pdVar5[uVar13];
            uVar13 = uVar13 + 1;
          } while (local_98.m_storage.m_rows != uVar13);
        }
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_168;
        auVar22 = vsqrtsd_avx(auVar19._0_16_,auVar22);
        local_168 = auVar22._0_8_;
        if (1 < (this->super_ChOptimizer).grad_evaluations) {
          if (local_a8.m_storage.m_rows < 0) goto LAB_007ebbee;
          if (local_98.m_storage.m_rows != local_a8.m_storage.m_rows) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                         );
          }
          auVar17._0_8_ = local_168 / local_80;
          auVar17._8_8_ = 0;
          if (7 < local_98.m_storage.m_rows) {
            auVar18 = vbroadcastsd_avx512f(auVar17);
            lVar12 = 0;
            do {
              auVar19 = vmulpd_avx512f(auVar18,*(undefined1 (*) [64])
                                                (local_a8.m_storage.m_data + lVar12));
              auVar19 = vaddpd_avx512f(auVar19,*(undefined1 (*) [64])
                                                (local_98.m_storage.m_data + lVar12));
              *(undefined1 (*) [64])(local_98.m_storage.m_data + lVar12) = auVar19;
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar15);
          }
          if ((long)uVar15 < local_98.m_storage.m_rows) {
            do {
              local_98.m_storage.m_data[uVar15] =
                   auVar17._0_8_ * local_a8.m_storage.m_data[uVar15] +
                   local_98.m_storage.m_data[uVar15];
              uVar15 = uVar15 + 1;
            } while (local_98.m_storage.m_rows != uVar15);
          }
        }
        if (local_a8.m_storage.m_rows != local_98.m_storage.m_rows) {
          auVar19 = ZEXT1664(auVar19._0_16_);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_a8,local_98.m_storage.m_rows,1);
        }
        IVar8 = local_98.m_storage.m_rows;
        pdVar5 = local_98.m_storage.m_data;
        if (local_a8.m_storage.m_rows == IVar10) {
          uVar15 = local_a8.m_storage.m_rows + 7;
          if (-1 < local_a8.m_storage.m_rows) {
            uVar15 = local_a8.m_storage.m_rows;
          }
          uVar15 = uVar15 & 0xfffffffffffffff8;
          if (7 < local_a8.m_storage.m_rows) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_a8.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar9 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar15);
          }
          if ((long)uVar15 < local_a8.m_storage.m_rows) {
            do {
              local_a8.m_storage.m_data[uVar15] = pdVar9[uVar15];
              uVar15 = uVar15 + 1;
            } while (local_a8.m_storage.m_rows != uVar15);
          }
          if (local_128.m_storage.m_rows != local_98.m_storage.m_rows) {
            auVar19 = ZEXT1664(auVar19._0_16_);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_128,local_98.m_storage.m_rows,1);
          }
          if (local_128.m_storage.m_rows == IVar8) {
            uVar15 = local_128.m_storage.m_rows + 7;
            if (-1 < local_128.m_storage.m_rows) {
              uVar15 = local_128.m_storage.m_rows;
            }
            uVar15 = uVar15 & 0xfffffffffffffff8;
            if (7 < local_128.m_storage.m_rows) {
              lVar12 = 0;
              do {
                *(undefined1 (*) [64])(local_128.m_storage.m_data + lVar12) =
                     *(undefined1 (*) [64])(pdVar5 + lVar12);
                lVar12 = lVar12 + 8;
              } while (lVar12 < (long)uVar15);
            }
            if ((long)uVar15 < local_128.m_storage.m_rows) {
              do {
                local_128.m_storage.m_data[uVar15] = pdVar5[uVar15];
                uVar15 = uVar15 + 1;
              } while (local_128.m_storage.m_rows != uVar15);
            }
            local_80 = local_168;
            goto LAB_007eae8b;
          }
        }
      }
LAB_007ebc49:
      pcVar16 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_007ebc5e:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar16);
    }
LAB_007eae8b:
    auVar22 = auVar19._0_16_;
    dVar20 = local_148;
    if (-1 < this->maxdilationsteps) {
      local_168 = local_140;
      iVar14 = 0;
      do {
        IVar8 = local_128.m_storage.m_rows;
        pdVar9 = local_128.m_storage.m_data;
        pdVar5 = local_178.m_storage.m_data;
        auVar22 = auVar19._0_16_;
        if (local_128.m_storage.m_rows < 0) goto LAB_007ebbee;
        if (local_178.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_007ebc27;
        if (local_108.m_storage.m_rows != local_128.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_108,local_128.m_storage.m_rows,1);
        }
        if (local_108.m_storage.m_rows != IVar8) goto LAB_007ebc10;
        uVar15 = local_108.m_storage.m_rows + 7;
        if (-1 < local_108.m_storage.m_rows) {
          uVar15 = local_108.m_storage.m_rows;
        }
        uVar15 = uVar15 & 0xfffffffffffffff8;
        if (7 < local_108.m_storage.m_rows) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_b8;
          auVar19 = vbroadcastsd_avx512f(auVar1);
          lVar12 = 0;
          do {
            auVar18 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])(pdVar9 + lVar12));
            auVar18 = vaddpd_avx512f(auVar18,*(undefined1 (*) [64])(pdVar5 + lVar12));
            *(undefined1 (*) [64])(local_108.m_storage.m_data + lVar12) = auVar18;
            lVar12 = lVar12 + 8;
          } while (lVar12 < (long)uVar15);
        }
        if ((long)uVar15 < local_108.m_storage.m_rows) {
          do {
            local_108.m_storage.m_data[uVar15] = local_b8 * pdVar9[uVar15] + pdVar5[uVar15];
            uVar15 = uVar15 + 1;
          } while (local_108.m_storage.m_rows != uVar15);
        }
        auVar19 = ZEXT1664(auVar22);
        dVar20 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_108);
        auVar22 = auVar19._0_16_;
        if (dVar20 <= local_168) break;
        local_b8 = local_b8 * this->dilation;
        uStack_b0 = 0;
        bVar6 = iVar14 < this->maxdilationsteps;
        iVar14 = iVar14 + 1;
        local_168 = dVar20;
      } while (bVar6);
    }
    IVar8 = local_128.m_storage.m_rows;
    pdVar9 = local_128.m_storage.m_data;
    pdVar5 = local_178.m_storage.m_data;
    local_148 = dVar20;
    if (local_128.m_storage.m_rows < 0) {
LAB_007ebbee:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (local_178.m_storage.m_rows != local_128.m_storage.m_rows) {
LAB_007ebc27:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
                   );
    }
    uStack_160 = 0;
    local_168 = local_b8 * 0.5;
    if (local_138.m_storage.m_rows != local_128.m_storage.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_138,local_128.m_storage.m_rows,1);
    }
    if (local_138.m_storage.m_rows != IVar8) {
LAB_007ebc10:
      pcVar16 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
      ;
      goto LAB_007ebc5e;
    }
    uVar15 = local_138.m_storage.m_rows + 7;
    if (-1 < local_138.m_storage.m_rows) {
      uVar15 = local_138.m_storage.m_rows;
    }
    uVar15 = uVar15 & 0xfffffffffffffff8;
    if (7 < local_138.m_storage.m_rows) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_168;
      auVar19 = vbroadcastsd_avx512f(auVar2);
      lVar12 = 0;
      do {
        auVar18 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])(pdVar9 + lVar12));
        auVar18 = vaddpd_avx512f(auVar18,*(undefined1 (*) [64])(pdVar5 + lVar12));
        *(undefined1 (*) [64])(local_138.m_storage.m_data + lVar12) = auVar18;
        lVar12 = lVar12 + 8;
      } while (lVar12 < (long)uVar15);
    }
    if ((long)uVar15 < local_138.m_storage.m_rows) {
      do {
        local_138.m_storage.m_data[uVar15] = local_168 * pdVar9[uVar15] + pdVar5[uVar15];
        uVar15 = uVar15 + 1;
      } while (local_138.m_storage.m_rows != uVar15);
    }
    in_ZMM2 = ZEXT1664(auVar22);
    local_168 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_138);
    auVar22 = in_ZMM2._0_16_;
    if ((-1 < this->maxbisections) &&
       ((this->super_ChOptimizer).fx_evaluations <= (long)this->maxevaluations)) {
      iVar14 = 0;
      iVar11 = 1;
      while( true ) {
        IVar8 = local_128.m_storage.m_rows;
        pdVar9 = local_128.m_storage.m_data;
        pdVar5 = local_178.m_storage.m_data;
        auVar22 = in_ZMM2._0_16_;
        local_68 = local_b8 * 0.25;
        uStack_60 = 0;
        local_6c = iVar14;
        if (local_128.m_storage.m_rows < 0) goto LAB_007ebbee;
        if (local_178.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_007ebc27;
        if (local_d8.m_storage.m_rows != local_128.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_d8,local_128.m_storage.m_rows,1);
        }
        if (local_d8.m_storage.m_rows != IVar8) goto LAB_007ebc10;
        uVar15 = local_d8.m_storage.m_rows + 7;
        if (-1 < local_d8.m_storage.m_rows) {
          uVar15 = local_d8.m_storage.m_rows;
        }
        uVar15 = uVar15 & 0xfffffffffffffff8;
        if (7 < local_d8.m_storage.m_rows) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_68;
          auVar19 = vbroadcastsd_avx512f(auVar3);
          lVar12 = 0;
          do {
            auVar18 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])(pdVar9 + lVar12));
            auVar18 = vaddpd_avx512f(auVar18,*(undefined1 (*) [64])(pdVar5 + lVar12));
            *(undefined1 (*) [64])(local_d8.m_storage.m_data + lVar12) = auVar18;
            lVar12 = lVar12 + 8;
          } while (lVar12 < (long)uVar15);
        }
        if ((long)uVar15 < local_d8.m_storage.m_rows) {
          do {
            local_d8.m_storage.m_data[uVar15] = local_68 * pdVar9[uVar15] + pdVar5[uVar15];
            uVar15 = uVar15 + 1;
          } while (local_d8.m_storage.m_rows != uVar15);
        }
        local_150 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_d8);
        IVar8 = local_128.m_storage.m_rows;
        pdVar9 = local_128.m_storage.m_data;
        pdVar5 = local_178.m_storage.m_data;
        if (local_128.m_storage.m_rows < 0) goto LAB_007ebbee;
        if (local_178.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_007ebc27;
        uStack_110 = 0;
        local_118 = local_b8 * 0.75;
        if (local_e8.m_storage.m_rows != local_128.m_storage.m_rows) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_e8,local_128.m_storage.m_rows,1);
        }
        if (local_e8.m_storage.m_rows != IVar8) goto LAB_007ebc10;
        uVar15 = local_e8.m_storage.m_rows + 7;
        if (-1 < local_e8.m_storage.m_rows) {
          uVar15 = local_e8.m_storage.m_rows;
        }
        uVar15 = uVar15 & 0xfffffffffffffff8;
        if (7 < local_e8.m_storage.m_rows) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_118;
          auVar19 = vbroadcastsd_avx512f(auVar4);
          lVar12 = 0;
          do {
            auVar18 = vmulpd_avx512f(auVar19,*(undefined1 (*) [64])(pdVar9 + lVar12));
            auVar18 = vaddpd_avx512f(auVar18,*(undefined1 (*) [64])(pdVar5 + lVar12));
            *(undefined1 (*) [64])(local_e8.m_storage.m_data + lVar12) = auVar18;
            lVar12 = lVar12 + 8;
          } while (lVar12 < (long)uVar15);
        }
        if ((long)uVar15 < local_e8.m_storage.m_rows) {
          do {
            local_e8.m_storage.m_data[uVar15] = local_118 * pdVar9[uVar15] + pdVar5[uVar15];
            uVar15 = uVar15 + 1;
          } while (local_e8.m_storage.m_rows != uVar15);
        }
        in_ZMM2 = ZEXT1664(auVar22);
        local_118 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_e8);
        IVar8 = local_138.m_storage.m_rows;
        pdVar5 = local_138.m_storage.m_data;
        bVar6 = false;
        if ((local_150 <= local_168) && (bVar6 = false, local_168 <= local_118)) {
          if (local_178.m_storage.m_rows != local_138.m_storage.m_rows) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_178,local_138.m_storage.m_rows,1);
          }
          IVar10 = local_e8.m_storage.m_rows;
          pdVar9 = local_e8.m_storage.m_data;
          if (local_178.m_storage.m_rows != IVar8) goto LAB_007ebc49;
          uVar15 = local_178.m_storage.m_rows + 7;
          if (-1 < local_178.m_storage.m_rows) {
            uVar15 = local_178.m_storage.m_rows;
          }
          uVar15 = uVar15 & 0xfffffffffffffff8;
          if (7 < local_178.m_storage.m_rows) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_178.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar5 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar15);
          }
          if ((long)uVar15 < local_178.m_storage.m_rows) {
            do {
              local_178.m_storage.m_data[uVar15] = pdVar5[uVar15];
              uVar15 = uVar15 + 1;
            } while (local_178.m_storage.m_rows != uVar15);
          }
          if (local_138.m_storage.m_rows != local_e8.m_storage.m_rows) {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_138,local_e8.m_storage.m_rows,1);
          }
          if (local_138.m_storage.m_rows != IVar10) goto LAB_007ebc49;
          uVar15 = local_138.m_storage.m_rows + 7;
          if (-1 < local_138.m_storage.m_rows) {
            uVar15 = local_138.m_storage.m_rows;
          }
          uVar15 = uVar15 & 0xfffffffffffffff8;
          if (7 < local_138.m_storage.m_rows) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_138.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar9 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar15);
          }
          if ((long)uVar15 < local_138.m_storage.m_rows) {
            do {
              local_138.m_storage.m_data[uVar15] = pdVar9[uVar15];
              uVar15 = uVar15 + 1;
            } while (local_138.m_storage.m_rows != uVar15);
          }
          local_140 = local_168;
          local_168 = local_118;
          bVar6 = true;
        }
        IVar8 = local_138.m_storage.m_rows;
        pdVar5 = local_138.m_storage.m_data;
        if (((local_168 <= local_150) && (local_118 <= local_168)) && (!bVar6)) {
          if (local_108.m_storage.m_rows != local_138.m_storage.m_rows) {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_108,local_138.m_storage.m_rows,1);
          }
          IVar10 = local_d8.m_storage.m_rows;
          pdVar9 = local_d8.m_storage.m_data;
          if (local_108.m_storage.m_rows != IVar8) goto LAB_007ebc49;
          uVar15 = local_108.m_storage.m_rows + 7;
          if (-1 < local_108.m_storage.m_rows) {
            uVar15 = local_108.m_storage.m_rows;
          }
          uVar15 = uVar15 & 0xfffffffffffffff8;
          if (7 < local_108.m_storage.m_rows) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_108.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar5 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar15);
          }
          if ((long)uVar15 < local_108.m_storage.m_rows) {
            do {
              local_108.m_storage.m_data[uVar15] = pdVar5[uVar15];
              uVar15 = uVar15 + 1;
            } while (local_108.m_storage.m_rows != uVar15);
          }
          if (local_138.m_storage.m_rows != local_d8.m_storage.m_rows) {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_138,local_d8.m_storage.m_rows,1);
          }
          if (local_138.m_storage.m_rows != IVar10) goto LAB_007ebc49;
          uVar15 = local_138.m_storage.m_rows + 7;
          if (-1 < local_138.m_storage.m_rows) {
            uVar15 = local_138.m_storage.m_rows;
          }
          uVar15 = uVar15 & 0xfffffffffffffff8;
          if (7 < local_138.m_storage.m_rows) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_138.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar9 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar15);
          }
          bVar6 = true;
          if ((long)uVar15 < local_138.m_storage.m_rows) {
            do {
              local_138.m_storage.m_data[uVar15] = pdVar9[uVar15];
              uVar15 = uVar15 + 1;
            } while (local_138.m_storage.m_rows != uVar15);
          }
          local_148 = local_168;
          local_168 = local_150;
        }
        IVar8 = local_d8.m_storage.m_rows;
        pdVar5 = local_d8.m_storage.m_data;
        if (((local_150 <= local_168) && (local_118 <= local_168)) && (!bVar6)) {
          if (local_178.m_storage.m_rows != local_d8.m_storage.m_rows) {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_178,local_d8.m_storage.m_rows,1);
          }
          IVar10 = local_e8.m_storage.m_rows;
          pdVar9 = local_e8.m_storage.m_data;
          if (local_178.m_storage.m_rows != IVar8) goto LAB_007ebc49;
          uVar15 = local_178.m_storage.m_rows + 7;
          if (-1 < local_178.m_storage.m_rows) {
            uVar15 = local_178.m_storage.m_rows;
          }
          uVar15 = uVar15 & 0xfffffffffffffff8;
          if (7 < local_178.m_storage.m_rows) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_178.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar5 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar15);
          }
          if ((long)uVar15 < local_178.m_storage.m_rows) {
            do {
              local_178.m_storage.m_data[uVar15] = pdVar5[uVar15];
              uVar15 = uVar15 + 1;
            } while (local_178.m_storage.m_rows != uVar15);
          }
          if (local_108.m_storage.m_rows != local_e8.m_storage.m_rows) {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_108,local_e8.m_storage.m_rows,1);
          }
          if (local_108.m_storage.m_rows != IVar10) goto LAB_007ebc49;
          uVar15 = local_108.m_storage.m_rows + 7;
          if (-1 < local_108.m_storage.m_rows) {
            uVar15 = local_108.m_storage.m_rows;
          }
          uVar15 = uVar15 & 0xfffffffffffffff8;
          if (7 < local_108.m_storage.m_rows) {
            lVar12 = 0;
            do {
              *(undefined1 (*) [64])(local_108.m_storage.m_data + lVar12) =
                   *(undefined1 (*) [64])(pdVar9 + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 < (long)uVar15);
          }
          bVar6 = true;
          if ((long)uVar15 < local_108.m_storage.m_rows) {
            do {
              local_108.m_storage.m_data[uVar15] = pdVar9[uVar15];
              uVar15 = uVar15 + 1;
            } while (local_108.m_storage.m_rows != uVar15);
          }
          local_140 = local_150;
          local_148 = local_118;
        }
        auVar22 = in_ZMM2._0_16_;
        if (!bVar6) break;
        auVar7._8_8_ = 0x7fffffffffffffff;
        auVar7._0_8_ = 0x7fffffffffffffff;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_168 - local_140;
        auVar17 = vandpd_avx512vl(auVar21,auVar7);
        if (auVar17._0_8_ <= this->fun_tol) {
          builtin_strncpy(local_78,"OK,function tolerance reached.",0x1f);
          iVar14 = 0xb;
          goto LAB_007eba8d;
        }
        local_b8 = local_b8 * 0.5;
        uStack_b0 = 0;
        if ((this->maxbisections <= local_6c) ||
           (iVar14 = iVar11, iVar11 = iVar11 + 1,
           (long)this->maxevaluations < (this->super_ChOptimizer).fx_evaluations))
        goto LAB_007eb711;
      }
      local_b8 = local_68;
      uStack_b0 = uStack_60;
    }
LAB_007eb711:
    IVar8 = local_d8.m_storage.m_rows;
    pdVar5 = local_d8.m_storage.m_data;
    if ((local_140 <= local_150) &&
       (((local_168 <= local_150 && (local_118 <= local_150)) && (local_148 <= local_150)))) {
      if (local_178.m_storage.m_rows != local_d8.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_178,local_d8.m_storage.m_rows,1);
      }
      if (local_178.m_storage.m_rows != IVar8) goto LAB_007ebc49;
      uVar15 = local_178.m_storage.m_rows + 7;
      if (-1 < local_178.m_storage.m_rows) {
        uVar15 = local_178.m_storage.m_rows;
      }
      uVar15 = uVar15 & 0xfffffffffffffff8;
      if (7 < local_178.m_storage.m_rows) {
        lVar12 = 0;
        do {
          *(undefined1 (*) [64])(local_178.m_storage.m_data + lVar12) =
               *(undefined1 (*) [64])(pdVar5 + lVar12);
          lVar12 = lVar12 + 8;
        } while (lVar12 < (long)uVar15);
      }
      if ((long)uVar15 < local_178.m_storage.m_rows) {
        do {
          local_178.m_storage.m_data[uVar15] = pdVar5[uVar15];
          uVar15 = uVar15 + 1;
        } while (local_178.m_storage.m_rows != uVar15);
      }
    }
    IVar8 = local_e8.m_storage.m_rows;
    pdVar5 = local_e8.m_storage.m_data;
    if (((local_150 <= local_118) && (local_140 <= local_118)) &&
       ((local_168 <= local_118 && (local_148 <= local_118)))) {
      if (local_178.m_storage.m_rows != local_e8.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_178,local_e8.m_storage.m_rows,1);
      }
      if (local_178.m_storage.m_rows != IVar8) goto LAB_007ebc49;
      uVar15 = local_178.m_storage.m_rows + 7;
      if (-1 < local_178.m_storage.m_rows) {
        uVar15 = local_178.m_storage.m_rows;
      }
      uVar15 = uVar15 & 0xfffffffffffffff8;
      if (7 < local_178.m_storage.m_rows) {
        lVar12 = 0;
        do {
          *(undefined1 (*) [64])(local_178.m_storage.m_data + lVar12) =
               *(undefined1 (*) [64])(pdVar5 + lVar12);
          lVar12 = lVar12 + 8;
        } while (lVar12 < (long)uVar15);
      }
      if ((long)uVar15 < local_178.m_storage.m_rows) {
        do {
          local_178.m_storage.m_data[uVar15] = pdVar5[uVar15];
          uVar15 = uVar15 + 1;
        } while (local_178.m_storage.m_rows != uVar15);
      }
    }
    IVar8 = local_138.m_storage.m_rows;
    pdVar5 = local_138.m_storage.m_data;
    if (((local_140 <= local_168) && (local_150 <= local_168)) &&
       ((local_118 <= local_168 && (local_148 <= local_168)))) {
      if (local_178.m_storage.m_rows != local_138.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_178,local_138.m_storage.m_rows,1);
      }
      if (local_178.m_storage.m_rows != IVar8) goto LAB_007ebc49;
      uVar15 = local_178.m_storage.m_rows + 7;
      if (-1 < local_178.m_storage.m_rows) {
        uVar15 = local_178.m_storage.m_rows;
      }
      uVar15 = uVar15 & 0xfffffffffffffff8;
      if (7 < local_178.m_storage.m_rows) {
        lVar12 = 0;
        do {
          *(undefined1 (*) [64])(local_178.m_storage.m_data + lVar12) =
               *(undefined1 (*) [64])(pdVar5 + lVar12);
          lVar12 = lVar12 + 8;
        } while (lVar12 < (long)uVar15);
      }
      if ((long)uVar15 < local_178.m_storage.m_rows) {
        do {
          local_178.m_storage.m_data[uVar15] = pdVar5[uVar15];
          uVar15 = uVar15 + 1;
        } while (local_178.m_storage.m_rows != uVar15);
      }
    }
    IVar8 = local_108.m_storage.m_rows;
    pdVar5 = local_108.m_storage.m_data;
    if ((((local_140 <= local_148) && (local_150 <= local_148)) && (local_168 <= local_148)) &&
       (local_118 <= local_148)) {
      if (local_178.m_storage.m_rows != local_108.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_178,local_108.m_storage.m_rows,1);
      }
      if (local_178.m_storage.m_rows != IVar8) goto LAB_007ebc49;
      uVar15 = local_178.m_storage.m_rows + 7;
      if (-1 < local_178.m_storage.m_rows) {
        uVar15 = local_178.m_storage.m_rows;
      }
      uVar15 = uVar15 & 0xfffffffffffffff8;
      if (7 < local_178.m_storage.m_rows) {
        lVar12 = 0;
        do {
          *(undefined1 (*) [64])(local_178.m_storage.m_data + lVar12) =
               *(undefined1 (*) [64])(pdVar5 + lVar12);
          lVar12 = lVar12 + 8;
        } while (lVar12 < (long)uVar15);
      }
      if ((long)uVar15 < local_178.m_storage.m_rows) {
        do {
          local_178.m_storage.m_data[uVar15] = pdVar5[uVar15];
          uVar15 = uVar15 + 1;
        } while (local_178.m_storage.m_rows != uVar15);
      }
    }
    in_ZMM2 = ZEXT1664(auVar22);
    local_140 = ChOptimizer::Eval_fx(&this->super_ChOptimizer,(ChVectorDynamic<> *)&local_178);
    if ((long)this->maxevaluations < (this->super_ChOptimizer).fx_evaluations) {
      lVar12 = (this->super_ChOptimizer).grad_evaluations;
      pcVar16 = "OK, limit on max number of fx evaluations reached in %ld steps";
LAB_007eba81:
      sprintf(local_78,pcVar16,lVar12);
      iVar14 = 6;
    }
    else {
      lVar12 = (this->super_ChOptimizer).grad_evaluations;
      iVar14 = 0;
      if (this->maxgradients < lVar12) {
        pcVar16 = "OK, limit on max number of %ld gradient evaluations reached.";
        goto LAB_007eba81;
      }
    }
LAB_007eba8d:
    if (iVar14 != 0) {
      if (((iVar14 == 0xb) || (iVar14 == 6)) &&
         (((this->super_ChOptimizer).opt_fx = local_140, (this->super_ChOptimizer).C_vars != 0 &&
          (0 < local_bc)))) {
        pdVar5 = (this->super_ChOptimizer).xv;
        uVar15 = 0;
        do {
          if ((~(local_178.m_storage.m_rows >> 0x3f) & local_178.m_storage.m_rows) == uVar15) {
LAB_007ebc6b:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar5[uVar15] = local_178.m_storage.m_data[uVar15];
          uVar15 = uVar15 + 1;
        } while (size_00 != uVar15);
      }
      if (local_e8.m_storage.m_data != (double *)0x0) {
        free((void *)local_e8.m_storage.m_data[-1]);
      }
      if (local_d8.m_storage.m_data != (double *)0x0) {
        free((void *)local_d8.m_storage.m_data[-1]);
      }
      if (local_138.m_storage.m_data != (double *)0x0) {
        free((void *)local_138.m_storage.m_data[-1]);
      }
      if (local_a8.m_storage.m_data != (double *)0x0) {
        free((void *)local_a8.m_storage.m_data[-1]);
      }
      if (local_98.m_storage.m_data != (double *)0x0) {
        free((void *)local_98.m_storage.m_data[-1]);
      }
      if (local_128.m_storage.m_data != (double *)0x0) {
        free((void *)local_128.m_storage.m_data[-1]);
      }
      if (local_108.m_storage.m_data != (double *)0x0) {
        free((void *)local_108.m_storage.m_data[-1]);
      }
      if (local_178.m_storage.m_data != (double *)0x0) {
        free((void *)local_178.m_storage.m_data[-1]);
      }
      return true;
    }
  } while( true );
}

Assistant:

bool ChOptimizerGradient::DoOptimize() {
    double nstep = initial_step;
    int dilationstep;
    int bisections;
    double fx, fxguess = 0, fxmid, fx1 = 0, fx2 = 0, lastgood, normGold = 0, normGnew;

    // count vars
    int nv = GetNumOfVars();

    nstep = initial_step;

    // allocate variables vector
    ChVectorDynamic<> mX(nv);       // the variables
    ChVectorDynamic<> mXguess(nv);  // the guessed variables
    ChVectorDynamic<> mG(nv);       // the gradient
    ChVectorDynamic<> mGcn(nv);     // the conjugate gradient
    ChVectorDynamic<> mGcnold(nv);  // the old conjugate gradient
    ChVectorDynamic<> mXmid(nv);    // the bisection center
    ChVectorDynamic<> mX1(nv);      // the bisection left
    ChVectorDynamic<> mX2(nv);      // the bisection right

    // populate vector with starting approximation
    // system->vector

    for (int i = 0; i < nv; i++) {
        mX(i) = xv[i];
    };
    // System_to_Vars(&mX);

    fx = Eval_fx(mX);

    // perform iterative optimization..

    while (true) {
        // compute gradient here;
        Eval_grad(mX, mG);

        // correction for conjugate gradient method?
        if (do_conjugate) {
            normGnew = mG.norm();
            mGcn = mG;
            if (grad_evaluations > 1) {
                mGcn += (normGnew / normGold) * mGcnold;  // update conj.gradient direction
            }
            mGcnold = mGcn;
            normGold = normGnew;
            mG = mGcn;  // use the conjugate gradient!
        }

        // Forward dilation search;
        dilationstep = 0;
        lastgood = fx;
        while (true) {
            if (dilationstep > maxdilationsteps)
                break;
            dilationstep++;

            // compute new fx position;
            mXguess = mX + nstep * mG;

            fxguess = Eval_fx(mXguess);

            if (fxguess <= lastgood) {
                break;
            }

            nstep *= dilation;
            lastgood = fxguess;
        }

        // Backward bisection search;
        bisections = 0;
        bool gone;

        mXmid = mX + (nstep * 0.5) * mG; // initialize mid

        fxmid = Eval_fx(mXmid);

        while (true) {
            if (bisections > maxbisections)
                break;
            bisections++;
            if (fx_evaluations > maxevaluations)
                break;

            mX1 = mX + (nstep * 0.25) * mG; // initialize left
            fx1 = Eval_fx(mX1);

            mX2 = mX + (nstep * 0.75) * mG; // initialize right
            fx2 = Eval_fx(mX2);

            gone = false;
            if ((fx1 <= fxmid) && (fxmid <= fx2) && !gone) {
                mX = mXmid;
                fx = fxmid;
                mXmid = mX2;
                fxmid = fx2;
                gone = true;
            }
            if ((fx1 >= fxmid) && (fxmid >= fx2) && !gone) {
                mXguess = mXmid;
                fxguess = fxmid;
                mXmid = mX1;
                fxmid = fx1;
                gone = true;
            }
            if ((fx1 <= fxmid) && (fxmid >= fx2) && !gone) {
                mX = mX1;
                fx = fx1;
                mXguess = mX2;
                fxguess = fx2;
                gone = true;
            }
            if (!gone) {
                nstep *= 0.25;
                break;
            }

            if (fabs(fxmid - fx) <= fun_tol) {
                // cout << "\n              ---- ";
                sprintf(err_message, "OK,function tolerance reached.");
                goto end_opt;
            }
            // ***TO DO*** stop after "arg_tol" passed

            // half step, then repeat
            nstep *= 0.5;
        }

        if ((fx1 >= fx) && (fx1 >= fxmid) && (fx1 >= fx2) && (fx1 >= fxguess))
            mX = mX1;
        if ((fx2 >= fx) && (fx2 >= fxmid) && (fx2 >= fx1) && (fx2 >= fxguess))
            mX = mX2;
        if ((fxmid >= fx) && (fxmid >= fx1) && (fxmid >= fx2) && (fxmid >= fxguess))
            mX = mXmid;
        if ((fxguess >= fx) && (fxguess >= fx1) && (fxguess >= fx2) && (fxguess >= fxmid))
            mX = mXguess;

        fx = Eval_fx(mX);

        if (fx_evaluations > maxevaluations) {
            // cout << "\n          limit on fx evals----= ";
            sprintf(err_message, "OK, limit on max number of fx evaluations reached in %ld steps",
                    (long)grad_evaluations);
            break;
        }
        if (grad_evaluations > maxgradients) {
            // cout << "\n          limit on max gradients ---- ";
            sprintf(err_message, "OK, limit on max number of %ld gradient evaluations reached.",
                    (long)grad_evaluations);
            break;
        }
    }

    goto end_opt;

end_opt:
    // ***TO DO*** set the system at best variables among fx, fxguess, fx1, fx2;
    opt_fx = fx;

    if (C_vars) {
        for (int i = 0; i < nv; i++) {
            xv[i] = mX(i);
        };
    }  // copy result into vector xv

    return true;
}